

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O3

void Gia_ManHashResize(Gia_Man_t *p)

{
  uint uVar1;
  int *__ptr;
  ulong uVar2;
  uint uVar3;
  int *piVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  
  __ptr = p->pHTable;
  if (__ptr == (int *)0x0) {
    __assert_fail("p->pHTable != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0xa8,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  uVar1 = p->nHTable;
  iVar7 = ~(p->vCos->nSize + p->vCis->nSize) + p->nObjs;
  uVar8 = iVar7 * 2 - 1;
  while( true ) {
    do {
      uVar5 = uVar8 + 1;
      uVar3 = uVar8 & 1;
      uVar8 = uVar5;
    } while (uVar3 != 0);
    if (uVar5 < 9) break;
    iVar9 = 5;
    while (uVar5 % (iVar9 - 2U) != 0) {
      uVar3 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar5 < uVar3) goto LAB_006b7b3a;
    }
  }
LAB_006b7b3a:
  p->nHTable = uVar5;
  piVar4 = (int *)calloc((long)(int)uVar5,4);
  p->pHTable = piVar4;
  if ((int)uVar1 < 1) {
    iVar9 = 0;
  }
  else {
    uVar12 = 0;
    iVar9 = 0;
    do {
      uVar8 = __ptr[uVar12];
      if (uVar8 != 0) {
        if ((int)uVar8 < 0) {
LAB_006b7d85:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        if (p->nObjs <= (int)(uVar8 >> 1)) {
LAB_006b7d66:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs != (Gia_Obj_t *)0x0) {
          pGVar13 = p->pObjs + (uVar8 >> 1);
          pGVar6 = p->pObjs;
          uVar8 = pGVar13->Value;
          pGVar13->Value = 0;
          if (pGVar13 < pGVar6) {
LAB_006b7d28:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          do {
            iVar9 = iVar9 + 1;
            if (pGVar6 + p->nObjs <= pGVar13) goto LAB_006b7d28;
            iVar10 = (int)((long)pGVar13 - (long)pGVar6 >> 2) * -0x55555555;
            uVar2 = *(ulong *)pGVar13;
            iVar7 = iVar10 - ((uint)uVar2 & 0x1fffffff);
            if (iVar7 < 0) {
LAB_006b7d47:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10b,"int Abc_Var2Lit(int, int)");
            }
            uVar3 = (uint)(uVar2 >> 0x20);
            iVar11 = iVar10 - (uVar3 & 0x1fffffff);
            if (iVar11 < 0) goto LAB_006b7d47;
            if (p->pMuxes == (uint *)0x0) {
              uVar5 = 0xffffffff;
            }
            else {
              uVar5 = p->pMuxes[iVar10];
              uVar5 = -(uint)(uVar5 == 0) | uVar5;
            }
            piVar4 = Gia_ManHashFind(p,((uint)(uVar2 >> 0x1d) & 1) + iVar7 * 2,
                                     (uVar3 >> 0x1d & 1) + iVar11 * 2,uVar5);
            if (*piVar4 != 0) {
              __assert_fail("*pPlace == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                            ,0xb8,"void Gia_ManHashResize(Gia_Man_t *)");
            }
            pGVar6 = p->pObjs;
            if ((pGVar13 < pGVar6) || (pGVar6 + p->nObjs <= pGVar13)) goto LAB_006b7d28;
            iVar10 = (int)((ulong)((long)pGVar13 - (long)pGVar6) >> 2);
            iVar7 = iVar10 * -0x55555555;
            if (iVar7 < 0) goto LAB_006b7d47;
            *piVar4 = iVar10 * 0x55555556;
            if (iVar7 == 0) {
              __assert_fail("*pPlace != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                            ,0xba,"void Gia_ManHashResize(Gia_Man_t *)");
            }
            if (uVar8 == 0) break;
            if ((int)uVar8 < 0) goto LAB_006b7d85;
            if (p->nObjs <= (int)(uVar8 >> 1)) goto LAB_006b7d66;
            if (pGVar6 == (Gia_Obj_t *)0x0) break;
            pGVar13 = pGVar6 + (uVar8 >> 1);
            uVar8 = pGVar13->Value;
            pGVar13->Value = 0;
          } while( true );
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar1);
    iVar7 = ~(p->vCos->nSize + p->vCis->nSize) + p->nObjs;
  }
  if (iVar9 != iVar7 - p->nBufs) {
    __assert_fail("Counter == Counter2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0xbe,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManHashResize( Gia_Man_t * p )
{
    Gia_Obj_t * pThis;
    int * pHTableOld, * pPlace;
    int nHTableOld, iNext, Counter, Counter2, i;
    assert( p->pHTable != NULL );
    // replace the table
    pHTableOld = p->pHTable;
    nHTableOld = p->nHTable;
    p->nHTable = Abc_PrimeCudd( 2 * Gia_ManAndNum(p) ); 
    p->pHTable = ABC_CALLOC( int, p->nHTable );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nHTableOld; i++ )
    for ( pThis = (pHTableOld[i]? Gia_ManObj(p, Abc_Lit2Var(pHTableOld[i])) : NULL),
          iNext = (pThis? pThis->Value : 0);  
          pThis;  pThis = (iNext? Gia_ManObj(p, Abc_Lit2Var(iNext)) : NULL),   
          iNext = (pThis? pThis->Value : 0)  )
    {
        pThis->Value = 0;
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0p(p, pThis), Gia_ObjFaninLit1p(p, pThis), Gia_ObjFaninLit2p(p, pThis) );
        assert( *pPlace == 0 ); // should not be there
        *pPlace = Abc_Var2Lit( Gia_ObjId(p, pThis), 0 );
        assert( *pPlace != 0 );
        Counter++;
    }
    Counter2 = Gia_ManAndNum(p) - Gia_ManBufNum(p);
    assert( Counter == Counter2 );
    ABC_FREE( pHTableOld );
//    if ( p->fVerbose )
//        printf( "Resizing GIA hash table: %d -> %d.\n", nHTableOld, p->nHTable );
}